

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::GetAddedEdges(ObjEncoder *this)

{
  uint8_t uVar1;
  DataType DVar2;
  AttributeMetadata *this_00;
  PointAttribute *this_01;
  size_t sVar3;
  long in_RDI;
  PointAttribute *att;
  AttributeMetadata *att_metadata;
  GeometryMetadata *mesh_metadata;
  PointCloud *this_02;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  GeometryMetadata *in_stack_ffffffffffffffb8;
  AttributeMetadata *local_20;
  GeometryMetadata *local_18;
  bool local_1;
  
  local_18 = PointCloud::GetMetadata((PointCloud *)0x11ddd5);
  if (local_18 == (GeometryMetadata *)0x0) {
    local_1 = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    this_02 = (PointCloud *)&stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    this_00 = GeometryMetadata::GetAttributeMetadataByStringEntry
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
    if (this_00 == (AttributeMetadata *)0x0) {
      local_1 = true;
    }
    else {
      local_20 = this_00;
      AttributeMetadata::att_unique_id(this_00);
      this_01 = PointCloud::GetAttributeByUniqueId(this_02,(uint32_t)((ulong)this_00 >> 0x20));
      sVar3 = PointAttribute::size(this_01);
      if (((sVar3 != 0) &&
          (uVar1 = GeometryAttribute::num_components(&this_01->super_GeometryAttribute),
          uVar1 == '\x01')) &&
         (DVar2 = GeometryAttribute::data_type(&this_01->super_GeometryAttribute), DVar2 == DT_UINT8
         )) {
        *(PointAttribute **)(in_RDI + 0x28) = this_01;
        return true;
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ObjEncoder::GetAddedEdges() {
  const GeometryMetadata *mesh_metadata = in_mesh_->GetMetadata();
  if (!mesh_metadata) {
    return true;
  }

  // Try to get a per-corner attribute describing added edges.
  {
    const AttributeMetadata *att_metadata =
        mesh_metadata->GetAttributeMetadataByStringEntry("name", "added_edges");
    if (att_metadata) {
      const auto att =
          in_mesh_->GetAttributeByUniqueId(att_metadata->att_unique_id());
      if (att->size() == 0 || att->num_components() != 1 ||
          att->data_type() != DataType::DT_UINT8) {
        return false;
      }
      added_edges_att_ = att;
      return true;
    }
  }

  return true;
}